

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<StringWriter_WriteThreeByteLengthCharString_Test>::CreateTest
          (TestFactoryImpl<StringWriter_WriteThreeByteLengthCharString_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<StringWriter_WriteThreeByteLengthCharString_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x48);
  StringWriter_WriteThreeByteLengthCharString_Test::StringWriter_WriteThreeByteLengthCharString_Test
            ((StringWriter_WriteThreeByteLengthCharString_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }